

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O3

vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> * __thiscall
docopt::BranchPattern::flat
          (vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> *__return_storage_ptr__,
          BranchPattern *this,_func_bool_Pattern_ptr *filter)

{
  pointer psVar1;
  element_type *peVar2;
  bool bVar3;
  pointer psVar4;
  initializer_list<docopt::Pattern_*> __l;
  vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_> sublist;
  allocator_type local_41;
  BranchPattern *local_40;
  undefined8 local_38;
  
  bVar3 = (*filter)(&this->super_Pattern);
  if (bVar3) {
    __l._M_len = 1;
    __l._M_array = (iterator)&local_40;
    local_40 = this;
    std::vector<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>::vector
              (__return_storage_ptr__,__l,&local_41);
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    psVar4 = (this->fChildren).
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->fChildren).
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar1) {
      do {
        peVar2 = (psVar4->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (**peVar2->_vptr_Pattern)(&local_40,peVar2,filter);
        std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<docopt::Pattern**,std::vector<docopt::Pattern*,std::allocator<docopt::Pattern*>>>>
                  ((vector<docopt::Pattern*,std::allocator<docopt::Pattern*>> *)
                   __return_storage_ptr__,
                   (__return_storage_ptr__->
                   super__Vector_base<docopt::Pattern_*,_std::allocator<docopt::Pattern_*>_>).
                   _M_impl.super__Vector_impl_data._M_finish,local_40,local_38);
        if (local_40 != (BranchPattern *)0x0) {
          operator_delete(local_40);
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

virtual std::vector<Pattern*> flat(bool (*filter)(Pattern const*)) override {
			if (filter(this)) {
				return {this};
			}
			
			std::vector<Pattern*> ret;
			for(auto& child : fChildren) {
				auto sublist = child->flat(filter);
				ret.insert(ret.end(), sublist.begin(), sublist.end());
			}
			return ret;
		}